

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void * seq_writer_thread(void *args)

{
  storage_t *st;
  person_t p;
  int n;
  int i;
  int j;
  person_t *in_stack_fffffffffffff1e0;
  undefined1 in_stack_fffffffffffff22f;
  fdb_file_handle *in_stack_fffffffffffff230;
  person_t *in_stack_fffffffffffff268;
  storage_t *in_stack_fffffffffffff270;
  uint local_10;
  int local_c;
  
  for (local_c = 0; local_c < 10; local_c = local_c + 1) {
    for (local_10 = 0; (int)local_10 < 10000; local_10 = local_10 + 1) {
      gen_person(in_stack_fffffffffffff1e0);
      sprintf(&stack0xfffffffffffff1e0,"person%d",(ulong)local_10);
      e2e_fdb_set_person(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
    }
    e2e_fdb_commit(in_stack_fffffffffffff230,(bool)in_stack_fffffffffffff22f);
  }
  return (void *)0x0;
}

Assistant:

void *seq_writer_thread(void *args) {

    int j, i = 0, n=10000;
    person_t p;
    storage_t *st = (storage_t *)args;
    for (j = 0; j < 10; ++j) {
        for (i = 0; i < n; ++i) {
            gen_person(&p);
            p.age = i;
            sprintf(p.key, "person%d", i);
            e2e_fdb_set_person(st, &p);
        }
        e2e_fdb_commit(st->main, true);
    }
    return NULL;
}